

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySubImage3D::configureCubeMapArrayTexture
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          STORAGE_TYPE storType,GLuint clear_value)

{
  code *pcVar1;
  GLuint GVar2;
  STORAGE_TYPE SVar3;
  GLuint GVar4;
  int iVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  reference pvVar8;
  allocator<unsigned_int> local_49;
  undefined1 local_48 [8];
  DataBufferVec data_buffer;
  Functions *gl;
  STORAGE_TYPE local_20;
  GLuint clear_value_local;
  STORAGE_TYPE storType_local;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  TextureCubeMapArraySubImage3D *this_local;
  
  gl._4_4_ = clear_value;
  local_20 = storType;
  clear_value_local = depth;
  storType_local = height;
  depth_local = width;
  _height_local = this;
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar5 = (*pRVar7->_vptr_RenderContext[3])();
  data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar5);
  (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x1be))(1,&this->m_tex_cube_map_array_id)
  ;
  dVar6 = (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar6,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x141);
  (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x2e))
            (0x9009,this->m_tex_cube_map_array_id);
  dVar6 = (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar6,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x144);
  if (local_20 == ST_MUTABLE) {
    (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage + 0x4d8))(0x9009,0x813c);
    dVar6 = (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar6,"Error setting texture parameter.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x14a);
    (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage + 0x4d8))(0x9009,0x813d,0);
    dVar6 = (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar6,"Error setting texture parameter.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x14c);
    iVar5 = depth_local * storType_local * clear_value_local;
    std::allocator<unsigned_int>::allocator(&local_49);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
               (ulong)(uint)(iVar5 * 4),(value_type_conflict4 *)((long)&gl + 4),&local_49);
    std::allocator<unsigned_int>::~allocator(&local_49);
    GVar4 = depth_local;
    SVar3 = storType_local;
    GVar2 = clear_value_local;
    pcVar1 = *(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0x4c8);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,0);
    (*pcVar1)(0x9009,0,0x8d70,GVar4,SVar3,GVar2,0,0x8d99,0x1405,pvVar8);
    dVar6 = (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar6,"Error allocating texture object\'s data store",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x152);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  }
  else {
    (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage + 0x4e6))
              (0x9009,1,0x8d70,depth_local,storType_local,clear_value_local);
    dVar6 = (**(code **)(data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar6,"Error allocating texture object\'s data store",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x158);
    clearCubeMapArrayTexture(this,depth_local,storType_local,clear_value_local,gl._4_4_);
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::configureCubeMapArrayTexture(glw::GLuint width, glw::GLuint height,
																 glw::GLuint depth, STORAGE_TYPE storType,
																 glw::GLuint clear_value)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_tex_cube_map_array_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_tex_cube_map_array_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	/* used glTexImage3D() method if texture should be MUTABLE */
	if (storType == ST_MUTABLE)
	{
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_BASE_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture parameter.");
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAX_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture parameter.");

		DataBufferVec data_buffer(width * height * depth * m_n_components, clear_value);

		gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA32UI, width, height, depth, 0, GL_RGBA_INTEGER,
					  GL_UNSIGNED_INT, &data_buffer[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating texture object's data store");
	}
	/* used glTexStorage3D() method if texture should be IMMUTABLE */
	else
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 1, GL_RGBA32UI, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating texture object's data store");

		clearCubeMapArrayTexture(width, height, depth, clear_value);
	}
}